

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomurandom.cpp
# Opt level: O0

double __thiscall jrtplib::RTPRandomURandom::GetRandomDouble(RTPRandomURandom *this)

{
  double x;
  int64_t value2;
  uint64_t value;
  RTPRandomURandom *this_local;
  
  if (this->device == (FILE *)0x0) {
    this_local = (RTPRandomURandom *)0x0;
  }
  else {
    value = (uint64_t)this;
    fread(&value2,8,1,(FILE *)this->device);
    this_local = (RTPRandomURandom *)
                 ((double)(value2 & 0x7fffffffffffffff) * 1.0842021724855044e-19);
  }
  return (double)this_local;
}

Assistant:

double RTPRandomURandom::GetRandomDouble()
{
	if (!device)
		return 0;

	uint64_t value;

	fread(&value, sizeof(uint64_t), 1, device);

#ifdef RTP_HAVE_VSUINT64SUFFIX
	value &= 0x7fffffffffffffffui64;
#else
	value &= 0x7fffffffffffffffULL;
#endif // RTP_HAVE_VSUINT64SUFFIX

	int64_t value2 = (int64_t)value;
	double x = RTPRANDOM_2POWMIN63*(double)value2;

	return x;

}